

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLFormatter.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLFormatter::writeCharRef(XMLFormatter *this,XMLSize_t toWrite)

{
  XMLSize_t XVar1;
  XMLSize_t bufLen;
  XMLCh tmpBuf [64];
  XMLSize_t toWrite_local;
  XMLFormatter *this_local;
  
  bufLen._0_2_ = 0x26;
  bufLen._2_2_ = 0x23;
  bufLen._4_2_ = 0x78;
  tmpBuf._120_8_ = toWrite;
  XMLString::sizeToText(toWrite,(XMLCh *)((long)&bufLen + 6),0x20,0x10,this->fMemoryManager);
  XVar1 = XMLString::stringLen((XMLCh *)&bufLen);
  tmpBuf[XVar1 - 4] = L';';
  tmpBuf[XVar1 - 3] = L'\0';
  formatBuf(this,(XMLCh *)&bufLen,XVar1 + 1,NoEscapes,UnRep_Fail);
  return;
}

Assistant:

void XMLFormatter::writeCharRef(XMLSize_t toWrite)
{
    XMLCh tmpBuf[64];
    tmpBuf[0] = chAmpersand;
    tmpBuf[1] = chPound;
    tmpBuf[2] = chLatin_x;

    // Build a char ref for the current char
    XMLString::sizeToText(toWrite, &tmpBuf[3], 32, 16, fMemoryManager);
    const XMLSize_t bufLen = XMLString::stringLen(tmpBuf);
    tmpBuf[bufLen] = chSemiColon;
    tmpBuf[bufLen+1] = chNull;

    // write it out
    formatBuf(tmpBuf
            , bufLen + 1
            , XMLFormatter::NoEscapes
            , XMLFormatter::UnRep_Fail);

}